

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O1

void OPN2_GenerateStream(ym3438_t *chip,Bit16s *output,Bit32u numsamples)

{
  long lVar1;
  Bit16s buffer [2];
  Bit16s local_2c;
  Bit16s local_2a;
  
  if (numsamples != 0) {
    lVar1 = 0;
    do {
      OPN2_GenerateResampled(chip,&local_2c);
      output[lVar1 * 2] = local_2c;
      output[lVar1 * 2 + 1] = local_2a;
      lVar1 = lVar1 + 1;
    } while (numsamples != (Bit32u)lVar1);
  }
  return;
}

Assistant:

void OPN2_GenerateStream(ym3438_t *chip, Bit16s *output, Bit32u numsamples)
{
    Bit32u i;
    Bit16s buffer[2];

    for (i = 0; i < numsamples; i++)
    {
        OPN2_GenerateResampled(chip, buffer);
        *output++ = buffer[0];
        *output++ = buffer[1];
    }
}